

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O1

void __thiscall
GenericAssemblerFile::GenericAssemblerFile
          (GenericAssemblerFile *this,path *fileName,int64_t headerSize,bool overwrite)

{
  (this->super_AssemblerFile)._vptr_AssemblerFile =
       (_func_int **)&PTR__GenericAssemblerFile_001be6b8;
  this->originalHeaderSize = headerSize;
  this->headerSize = headerSize;
  ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::basic_ofstream(&this->stream);
  ghc::filesystem::path::path(&this->fileName,fileName);
  ghc::filesystem::path::path(&this->originalName);
  (*(this->super_AssemblerFile)._vptr_AssemblerFile[10])(this,0);
  this->mode = (uint)overwrite;
  return;
}

Assistant:

GenericAssemblerFile::GenericAssemblerFile(const fs::path& fileName, int64_t headerSize, bool overwrite)
	: originalHeaderSize(headerSize), headerSize(headerSize), fileName(fileName)
{
	this->seekPhysical(0);
	mode = overwrite ? Create : Open;
}